

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void init_inter_mode_search_state
               (InterModeSearchState *search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,
               int64_t best_rd_so_far)

{
  undefined2 uVar1;
  long lVar2;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  int ref_frame_1;
  int j_1;
  int i_5;
  int i_4;
  int i_3;
  int ref_frame;
  int j;
  int i_2;
  int i_1;
  int *rd_threshes;
  int i;
  uchar segment_id;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int local_6c;
  int local_68;
  int local_64;
  int iVar3;
  int iVar4;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_40;
  
  init_intra_mode_search_state((IntraModeSearchState *)0x2f9adf);
  av1_invalid_rd_stats((RD_STATS *)(in_RDI + 0x64c));
  *in_RDI = in_R8;
  in_RDI[1] = 0x7fffffffffffffff;
  in_RDI[2] = 0x7fffffffffffffff;
  memset(in_RDI + 3,0,0xb0);
  *(undefined4 *)(in_RDI + 0x19) = 0x7fffffff;
  *(undefined4 *)((long)in_RDI + 0xcc) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  *(undefined4 *)((long)in_RDI + 0xd4) = 0;
  *(undefined1 *)(in_RDI + 0x1b) = 0xff;
  uVar1 = *(undefined2 *)(**(long **)(in_RDX + 0x2058) + 0xa7);
  *(undefined4 *)((long)in_RDI + 0xdc) = 0;
  memset(in_RDI + 0x1c,0xff,0x40);
  memset(in_RDI + 0x24,0xff,0x20);
  for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
    in_RDI[(long)local_40 + 0x28] = 0;
  }
  lVar2 = in_RSI + 0x431dc + (ulong)((byte)uVar1 & 7) * 0x3a18 + (ulong)in_CL * 0x2a4;
  for (local_4c = 7; local_4c < 0x1c; local_4c = local_4c + 1) {
    in_RDI[(long)local_4c + 0x28] =
         (long)*(int *)(lVar2 + (long)local_4c * 4) *
         (long)*(int *)(in_RDX + 0x18c14 + (ulong)in_CL * 0x2a4 + (long)local_4c * 4) >> 5;
  }
  in_RDI[0xd1] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0xd2) = 0xffffffff;
  memset(in_RDI + 0xd6,0,0x60);
  memset(in_RDI + 0xe2,0,0x60);
  memset(in_RDI + 0xee,0,0x60);
  for (local_50 = 0xd; local_50 < 0x11; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
        in_RDI[(long)local_50 * 0x18 + (long)local_54 * 8 + (long)local_58 + 0xfa] =
             0x7fffffffffffffff;
        in_RDI[(long)local_50 * 0x18 + (long)local_54 * 8 + (long)local_58 + 0x352] =
             0x7fffffffffffffff;
      }
    }
  }
  for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
    in_RDI[(long)iVar4 + 0xd3] = 0x7fffffffffffffff;
  }
  if (*(char *)(in_RSI + 0x3bf81) != '\0') {
    for (iVar3 = 0x1c; iVar3 < 0x9c; iVar3 = iVar3 + 1) {
      in_RDI[(long)iVar3 + 0x28] =
           (long)*(int *)(lVar2 + (long)iVar3 * 4) *
           (long)*(int *)(in_RDX + 0x18c14 + (ulong)in_CL * 0x2a4 + (long)iVar3 * 4) >> 5;
    }
    for (local_64 = 0x11; local_64 < 0x19; local_64 = local_64 + 1) {
      for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
        for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
          in_RDI[(long)local_64 * 0x18 + (long)local_68 * 8 + (long)local_6c + 0xfa] =
               0x7fffffffffffffff;
          in_RDI[(long)local_64 * 0x18 + (long)local_68 * 8 + (long)local_6c + 0x352] =
               0x7fffffffffffffff;
        }
      }
    }
    init_single_inter_mode_search_state((InterModeSearchState *)CONCAT44(iVar4,iVar3));
  }
  return;
}

Assistant:

static inline void init_inter_mode_search_state(
    InterModeSearchState *search_state, const AV1_COMP *cpi,
    const MACROBLOCK *x, BLOCK_SIZE bsize, int64_t best_rd_so_far) {
  init_intra_mode_search_state(&search_state->intra_search_state);
  av1_invalid_rd_stats(&search_state->best_y_rdcost);

  search_state->best_rd = best_rd_so_far;
  search_state->best_skip_rd[0] = INT64_MAX;
  search_state->best_skip_rd[1] = INT64_MAX;

  av1_zero(search_state->best_mbmode);

  search_state->best_rate_y = INT_MAX;

  search_state->best_rate_uv = INT_MAX;

  search_state->best_mode_skippable = 0;

  search_state->best_skip2 = 0;

  search_state->best_mode_index = THR_INVALID;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const unsigned char segment_id = mbmi->segment_id;

  search_state->num_available_refs = 0;
  memset(search_state->dist_refs, -1, sizeof(search_state->dist_refs));
  memset(search_state->dist_order_refs, -1,
         sizeof(search_state->dist_order_refs));

  for (int i = 0; i <= LAST_NEW_MV_INDEX; ++i)
    search_state->mode_threshold[i] = 0;
  const int *const rd_threshes = cpi->rd.threshes[segment_id][bsize];
  for (int i = LAST_NEW_MV_INDEX + 1; i < SINGLE_REF_MODE_END; ++i)
    search_state->mode_threshold[i] =
        ((int64_t)rd_threshes[i] * x->thresh_freq_fact[bsize][i]) >>
        RD_THRESH_FAC_FRAC_BITS;

  search_state->best_intra_rd = INT64_MAX;

  search_state->best_pred_sse = UINT_MAX;

  av1_zero(search_state->single_newmv);
  av1_zero(search_state->single_newmv_rate);
  av1_zero(search_state->single_newmv_valid);
  for (int i = SINGLE_INTER_MODE_START; i < SINGLE_INTER_MODE_END; ++i) {
    for (int j = 0; j < MAX_REF_MV_SEARCH; ++j) {
      for (int ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame) {
        search_state->modelled_rd[i][j][ref_frame] = INT64_MAX;
        search_state->simple_rd[i][j][ref_frame] = INT64_MAX;
      }
    }
  }

  for (int i = 0; i < REFERENCE_MODES; ++i) {
    search_state->best_pred_rd[i] = INT64_MAX;
  }

  if (cpi->common.current_frame.reference_mode != SINGLE_REFERENCE) {
    for (int i = SINGLE_REF_MODE_END; i < THR_INTER_MODE_END; ++i)
      search_state->mode_threshold[i] =
          ((int64_t)rd_threshes[i] * x->thresh_freq_fact[bsize][i]) >>
          RD_THRESH_FAC_FRAC_BITS;

    for (int i = COMP_INTER_MODE_START; i < COMP_INTER_MODE_END; ++i) {
      for (int j = 0; j < MAX_REF_MV_SEARCH; ++j) {
        for (int ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame) {
          search_state->modelled_rd[i][j][ref_frame] = INT64_MAX;
          search_state->simple_rd[i][j][ref_frame] = INT64_MAX;
        }
      }
    }

    init_single_inter_mode_search_state(search_state);
  }
}